

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O1

char * u_strToUTF8WithSub_63
                 (char *dest,int32_t destCapacity,int32_t *pDestLength,UChar *pSrc,int32_t srcLength
                 ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  UChar UVar1;
  bool bVar2;
  UChar UVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  UChar *pUVar10;
  UChar *pUVar11;
  int iVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte *pbVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  int iVar20;
  byte *pbVar21;
  int local_4c;
  
  pbVar21 = (byte *)(dest + destCapacity);
  if (dest == (char *)0x0) {
    pbVar21 = (byte *)0x0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return (char *)0x0;
  }
  if ((((destCapacity < 0) || (srcLength < -1)) || (pSrc == (UChar *)0x0 && srcLength != 0)) ||
     ((0x10ffff < subchar || 0 < destCapacity && dest == (char *)0x0) ||
      (subchar & 0xfffff800U) == 0xd800)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (char *)0x0;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = 0;
  }
  if (srcLength == -1) {
    UVar3 = *pSrc;
    pbVar16 = (byte *)dest;
    if (UVar3 == L'\0') {
      uVar8 = 0;
      local_4c = 0;
    }
    else {
      local_4c = 0;
      pUVar10 = pSrc;
      uVar19 = 0;
      do {
        pSrc = pUVar10 + 1;
        bVar13 = (byte)UVar3;
        uVar8 = uVar19;
        if ((ushort)UVar3 < 0x80) {
          if (pbVar21 <= pbVar16) {
            uVar8 = 1;
            break;
          }
          *pbVar16 = bVar13;
          pbVar16 = pbVar16 + 1;
        }
        else if ((ushort)UVar3 < 0x800) {
          if ((long)pbVar21 - (long)pbVar16 < 2) {
            uVar8 = 2;
            break;
          }
          *pbVar16 = (byte)((ushort)UVar3 >> 6) | 0xc0;
          pbVar16[1] = bVar13 & 0x3f | 0x80;
          pbVar16 = pbVar16 + 2;
        }
        else if ((ushort)(UVar3 + L'\x2000') < 0xf800) {
          if ((long)pbVar21 - (long)pbVar16 < 3) {
            uVar8 = 3;
            break;
          }
          *pbVar16 = (byte)((ushort)UVar3 >> 0xc) | 0xe0;
          pbVar16[1] = (byte)((ushort)UVar3 >> 6) & 0x3f | 0x80;
          pbVar16[2] = bVar13 & 0x3f | 0x80;
          pbVar16 = pbVar16 + 3;
        }
        else {
          if ((((ushort)UVar3 >> 10 & 1) == 0) &&
             (UVar1 = *pSrc, ((ushort)UVar1 & 0xfc00) == 0xdc00)) {
            pSrc = pUVar10 + 2;
            uVar4 = (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
LAB_0018c65f:
            uVar8 = 1;
            if (((0x7f < uVar4) && (uVar8 = 2, 0x7ff < uVar4)) &&
               ((uVar8 = 3, 0xd7ff < uVar4 && (uVar8 = 0, 0xffefdfff < uVar4 - 0x110000)))) {
              uVar8 = 4 - (uVar4 < 0x10000);
            }
            iVar20 = 3;
            if ((long)(ulong)uVar8 <= (long)pbVar21 - (long)pbVar16) {
              bVar13 = (byte)uVar4;
              if ((int)uVar4 < 0x80) {
                *pbVar16 = bVar13;
                pbVar16 = pbVar16 + 1;
              }
              else if ((int)uVar4 < 0x800) {
                *pbVar16 = (byte)(uVar4 >> 6) | 0xc0;
                pbVar16[1] = bVar13 & 0x3f | 0x80;
                pbVar16 = pbVar16 + 2;
              }
              else if ((int)uVar4 < 0x10000) {
                *pbVar16 = (byte)(uVar4 >> 0xc) | 0xe0;
                pbVar16[1] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                pbVar16[2] = bVar13 & 0x3f | 0x80;
                pbVar16 = pbVar16 + 3;
              }
              else {
                *pbVar16 = (byte)(uVar4 >> 0x12) | 0xf0;
                pbVar16[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
                pbVar16[2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                pbVar16[3] = bVar13 & 0x3f | 0x80;
                pbVar16 = pbVar16 + 4;
              }
              iVar20 = 0;
              uVar8 = uVar19;
            }
          }
          else {
            if (-1 < subchar) {
              local_4c = local_4c + 1;
              uVar4 = subchar;
              goto LAB_0018c65f;
            }
            *pErrorCode = U_INVALID_CHAR_FOUND;
            iVar20 = 1;
          }
          if (iVar20 != 0) {
            if (iVar20 != 3) {
              return (char *)0x0;
            }
            break;
          }
        }
        UVar3 = *pSrc;
        pUVar10 = pSrc;
        uVar19 = uVar8;
      } while (UVar3 != L'\0');
    }
    iVar20 = (int)pbVar16;
    UVar3 = *pSrc;
    if (UVar3 != L'\0') {
      iVar12 = 3;
      if ((uint)subchar < 0x800) {
        iVar12 = 2 - (uint)((uint)subchar < 0x80);
      }
      iVar7 = 0;
      if (0xdfff < (uint)subchar) {
        iVar7 = 4 - (uint)((uint)subchar < 0x10000);
      }
      if ((uint)subchar < 0xd800) {
        iVar7 = iVar12;
      }
      do {
        pUVar10 = pSrc + 1;
        if ((ushort)UVar3 < 0x80) {
          uVar8 = uVar8 + 1;
          pSrc = pUVar10;
        }
        else if ((ushort)UVar3 < 0x800) {
          uVar8 = uVar8 + 2;
          pSrc = pUVar10;
        }
        else if ((UVar3 & 0xf800U) == 0xd800) {
          if ((((ushort)UVar3 >> 10 & 1) == 0) && ((*pUVar10 & 0xfc00U) == 0xdc00)) {
            uVar8 = uVar8 + 4;
            pSrc = pSrc + 2;
          }
          else {
            if (subchar < 0) {
              *pErrorCode = U_INVALID_CHAR_FOUND;
              return (char *)0x0;
            }
            uVar8 = uVar8 + iVar7;
            local_4c = local_4c + 1;
            pSrc = pUVar10;
          }
        }
        else {
          uVar8 = uVar8 + 3;
          pSrc = pUVar10;
        }
        UVar3 = *pSrc;
      } while (UVar3 != L'\0');
    }
    goto LAB_0018cbcf;
  }
  pUVar10 = pSrc + (uint)srcLength;
  if (pSrc == (UChar *)0x0) {
    pUVar10 = (UChar *)0x0;
  }
  uVar6 = ((long)pbVar21 - (long)dest) / 3;
  uVar9 = (ulong)((long)pUVar10 - (long)pSrc) >> 1;
  if ((int)uVar9 <= (int)uVar6) {
    uVar6 = uVar9;
  }
  uVar5 = uVar6 & 0xffffffff;
  uVar9 = 0;
  pbVar16 = (byte *)dest;
  if ((int)uVar6 < 3) {
    local_4c = 0;
  }
  else {
    bVar13 = (byte)((uint)subchar >> 0xc);
    bVar14 = (byte)((uint)subchar >> 6);
    bVar15 = bVar14 & 0x3f | 0x80;
    bVar17 = (byte)subchar & 0x3f | 0x80;
    local_4c = 0;
LAB_0018c7d1:
    do {
      iVar20 = (int)uVar5;
      pUVar11 = pSrc + 1;
      UVar3 = *pSrc;
      bVar18 = (byte)UVar3;
      if ((ushort)UVar3 < 0x80) {
        *pbVar16 = bVar18;
LAB_0018c7e2:
        pbVar16 = pbVar16 + 1;
        pSrc = pUVar11;
LAB_0018c84b:
        uVar5 = (ulong)(iVar20 - 1);
        if (1 < iVar20) goto LAB_0018c7d1;
      }
      else {
        if ((ushort)UVar3 < 0x800) {
          *pbVar16 = (byte)((ushort)UVar3 >> 6) | 0xc0;
          pbVar16[1] = bVar18 & 0x3f | 0x80;
LAB_0018c807:
          pbVar16 = pbVar16 + 2;
          pSrc = pUVar11;
          goto LAB_0018c84b;
        }
        if (((ushort)UVar3 + 0x2000 & 0xffff) < 0xf800) {
          *pbVar16 = (byte)((ushort)UVar3 >> 0xc) | 0xe0;
          pbVar16[1] = (byte)((ushort)UVar3 >> 6) & 0x3f | 0x80;
          pbVar16[2] = bVar18 & 0x3f | 0x80;
          pbVar16 = pbVar16 + 3;
          pSrc = pUVar11;
          goto LAB_0018c84b;
        }
        iVar20 = iVar20 + -1;
        if (iVar20 != 0) {
          if (((ushort)UVar3 >> 10 & 1) == 0) {
            UVar1 = *pUVar11;
            if (((ushort)UVar1 & 0xfc00) == 0xdc00) {
              uVar8 = (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
              *pbVar16 = (byte)(uVar8 >> 0x12) | 0xf0;
              pbVar16[1] = (byte)(uVar8 >> 0xc) & 0x3f | 0x80;
              pbVar16[2] = (byte)(uVar8 >> 6) & 0x3f | 0x80;
              pbVar16[3] = (byte)UVar1 & 0x3f | 0x80;
              pbVar16 = pbVar16 + 4;
              pSrc = pSrc + 2;
              goto LAB_0018c84b;
            }
          }
          if (-1 < subchar) {
            local_4c = local_4c + 1;
            if (subchar < 0x80) {
              *pbVar16 = (byte)subchar;
              goto LAB_0018c7e2;
            }
            if (subchar < 0x800) {
              *pbVar16 = bVar14 | 0xc0;
              pbVar16[1] = bVar17;
              goto LAB_0018c807;
            }
            if (subchar < 0x10000) {
              *pbVar16 = bVar13 | 0xe0;
              pbVar16[1] = bVar15;
              pbVar16[2] = bVar17;
              pbVar16 = pbVar16 + 3;
              pSrc = pUVar11;
            }
            else {
              *pbVar16 = (byte)((uint)subchar >> 0x12) | 0xf0;
              pbVar16[1] = bVar13 & 0x3f | 0x80;
              pbVar16[2] = bVar15;
              pbVar16[3] = bVar17;
              pbVar16 = pbVar16 + 4;
              pSrc = pUVar11;
            }
            goto LAB_0018c84b;
          }
          uVar8 = 0;
          goto LAB_0018cace;
        }
      }
      uVar6 = ((long)pbVar21 - (long)pbVar16) / 3;
      uVar5 = (ulong)((long)pUVar10 - (long)pSrc) >> 1;
      if ((int)uVar5 <= (int)uVar6) {
        uVar6 = uVar5;
      }
      uVar5 = uVar6 & 0xffffffff;
    } while (2 < (int)uVar6);
  }
  if (pSrc < pUVar10) {
    uVar9 = 0;
    do {
      pUVar11 = pSrc + 1;
      UVar3 = *pSrc;
      bVar13 = (byte)UVar3;
      if ((ushort)UVar3 < 0x80) {
        if (pbVar21 <= pbVar16) {
          uVar9 = 1;
          pSrc = pUVar11;
          break;
        }
        *pbVar16 = bVar13;
        pbVar16 = pbVar16 + 1;
        pSrc = pUVar11;
      }
      else if ((ushort)UVar3 < 0x800) {
        if ((long)pbVar21 - (long)pbVar16 < 2) {
          uVar9 = 2;
          pSrc = pUVar11;
          break;
        }
        *pbVar16 = (byte)((ushort)UVar3 >> 6) | 0xc0;
        pbVar16[1] = bVar13 & 0x3f | 0x80;
        pbVar16 = pbVar16 + 2;
        pSrc = pUVar11;
      }
      else if ((ushort)(UVar3 + L'\x2000') < 0xf800) {
        if ((long)pbVar21 - (long)pbVar16 < 3) {
          uVar9 = 3;
          pSrc = pUVar11;
          break;
        }
        *pbVar16 = (byte)((ushort)UVar3 >> 0xc) | 0xe0;
        pbVar16[1] = (byte)((ushort)UVar3 >> 6) & 0x3f | 0x80;
        pbVar16[2] = bVar13 & 0x3f | 0x80;
        pbVar16 = pbVar16 + 3;
        pSrc = pUVar11;
      }
      else {
        if ((pUVar11 < pUVar10 && ((ushort)UVar3 >> 10 & 1) == 0) &&
           (UVar1 = *pUVar11, (UVar1 & 0xfc00U) == 0xdc00)) {
          pUVar11 = pSrc + 2;
          uVar8 = (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
LAB_0018c4d9:
          uVar6 = 1;
          if ((((0x7f < uVar8) && (uVar6 = 2, 0x7ff < uVar8)) && (uVar6 = 3, 0xd7ff < uVar8)) &&
             (uVar6 = 0, 0xffefdfff < uVar8 - 0x110000)) {
            uVar6 = (ulong)(4 - (uVar8 < 0x10000));
          }
          if ((long)pbVar21 - (long)pbVar16 < (long)uVar6) {
            iVar20 = 0xb;
            uVar9 = uVar6;
            goto LAB_0018c558;
          }
          pbVar16 = _appendUTF8(pbVar16,uVar8);
          iVar20 = 0;
          bVar2 = true;
        }
        else {
          if (-1 < subchar) {
            local_4c = local_4c + 1;
            uVar8 = subchar;
            goto LAB_0018c4d9;
          }
          *pErrorCode = U_INVALID_CHAR_FOUND;
          iVar20 = 1;
LAB_0018c558:
          bVar2 = false;
        }
        uVar8 = (uint)uVar9;
        pSrc = pUVar11;
        if (iVar20 != 0) {
          if (iVar20 != 0xb) goto LAB_0018caa5;
          break;
        }
      }
    } while (pSrc < pUVar10);
  }
  uVar8 = (uint)uVar9;
  iVar20 = (int)pbVar16;
  bVar2 = true;
  if (pSrc < pUVar10) {
    iVar12 = 3;
    if ((uint)subchar < 0x800) {
      iVar12 = 2 - (uint)((uint)subchar < 0x80);
    }
    iVar7 = 0;
    if (0xdfff < (uint)subchar) {
      iVar7 = 4 - (uint)((uint)subchar < 0x10000);
    }
    if ((uint)subchar < 0xd800) {
      iVar7 = iVar12;
    }
    do {
      pUVar11 = pSrc + 1;
      UVar3 = *pSrc;
      uVar8 = (uint)uVar9;
      if ((ushort)UVar3 < 0x80) {
        uVar9 = (ulong)(uVar8 + 1);
      }
      else if ((ushort)UVar3 < 0x800) {
        uVar9 = (ulong)(uVar8 + 2);
      }
      else if ((UVar3 & 0xf800U) == 0xd800) {
        if ((pUVar11 < pUVar10 && ((ushort)UVar3 >> 10 & 1) == 0) &&
           ((*pUVar11 & 0xfc00U) == 0xdc00)) {
          pUVar11 = pSrc + 2;
          uVar9 = (ulong)(uVar8 + 4);
        }
        else {
          if (subchar < 0) goto LAB_0018cace;
          uVar9 = (ulong)(uVar8 + iVar7);
          local_4c = local_4c + 1;
        }
      }
      else {
        uVar9 = (ulong)(uVar8 + 3);
      }
      uVar8 = (uint)uVar9;
      pSrc = pUVar11;
    } while (pUVar11 < pUVar10);
  }
  else {
LAB_0018caa5:
    iVar20 = (int)pbVar16;
  }
LAB_0018cab9:
  if (!bVar2) {
    return (char *)0x0;
  }
LAB_0018cbcf:
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = local_4c;
  }
  iVar20 = uVar8 + (iVar20 - (int)dest);
  if (pDestLength != (int32_t *)0x0) {
    *pDestLength = iVar20;
  }
  u_terminateChars_63(dest,destCapacity,iVar20,pErrorCode);
  return dest;
LAB_0018cace:
  iVar20 = (int)pbVar16;
  *pErrorCode = U_INVALID_CHAR_FOUND;
  bVar2 = false;
  goto LAB_0018cab9;
}

Assistant:

U_CAPI char* U_EXPORT2 
u_strToUTF8WithSub(char *dest,
            int32_t destCapacity,
            int32_t *pDestLength,
            const UChar *pSrc,
            int32_t srcLength,
            UChar32 subchar, int32_t *pNumSubstitutions,
            UErrorCode *pErrorCode){
    int32_t reqLength=0;
    uint32_t ch=0,ch2=0;
    uint8_t *pDest = (uint8_t *)dest;
    uint8_t *pDestLimit = (pDest!=NULL)?(pDest + destCapacity):NULL;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
        
    if( (pSrc==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    numSubstitutions=0;

    if(srcLength==-1) {
        while((ch=*pSrc)!=0) {
            ++pSrc;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                /*need not check for NUL because NUL fails U16_IS_TRAIL() anyway*/
                if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while((ch=*pSrc++)!=0) {
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    } else {
        const UChar *pSrcLimit = (pSrc!=NULL)?(pSrc+srcLength):NULL;
        int32_t count;

        /* Faster loop without ongoing checking for pSrcLimit and pDestLimit. */
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            count = (int32_t)((pDestLimit - pDest) / 3);
            srcLength = (int32_t)(pSrcLimit - pSrc);
            if(count > srcLength) {
                count = srcLength; /* min(remaining dest/3, remaining src) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }
            do {
                ch=*pSrc++;
                if(ch <= 0x7f) {
                    *pDest++ = (uint8_t)ch;
                } else if(ch <= 0x7ff) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else if(ch <= 0xd7ff || ch >= 0xe000) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else /* ch is a surrogate */ {
                    /*
                     * We will read two UChars and probably output four bytes,
                     * which we didn't account for with computing count,
                     * so we adjust it here.
                     */
                    if(--count == 0) {
                        --pSrc; /* undo ch=*pSrc++ for the lead surrogate */
                        break;  /* recompute count */
                    }

                    if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                        ++pSrc;
                        ch=U16_GET_SUPPLEMENTARY(ch, ch2);

                        /* writing 4 bytes per 2 UChars is ok */
                        *pDest++=(uint8_t)((ch>>18)|0xf0);
                        *pDest++=(uint8_t)(((ch>>12)&0x3f)|0x80);
                        *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                        *pDest++=(uint8_t)((ch&0x3f)|0x80);
                    } else  {
                        /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                        if(subchar>=0) {
                            ch=subchar;
                            ++numSubstitutions;
                        } else {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        }

                        /* convert and append*/
                        pDest=_appendUTF8(pDest, ch);
                    }
                }
            } while(--count > 0);
        }

        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    }

    reqLength+=(int32_t)(pDest - (uint8_t *)dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}